

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_utilities.h
# Opt level: O2

bool Gudhi::persistence_matrix::
     _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>>
               (Field_element *val,
               Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
               *source,Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                       *targetColumn)

{
  bool bVar1;
  anon_class_1_0_00000001 local_23;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21;
  anon_class_16_2_6d7ca8c5 local_20;
  anon_class_16_2_6d7ca8c5 local_10;
  
  if (*val != 0) {
    local_20.targetColumn = targetColumn;
    local_20.val = val;
    local_10.targetColumn = targetColumn;
    local_10.val = val;
    bVar1 = _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,Gudhi::persistence_matrix::_multiply_source_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::Field_element_const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>const&,Gudhi::persisten___trix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>_>___1_>
                      (source,targetColumn,&local_21,&local_10,&local_20,&local_22,&local_23);
    return bVar1;
  }
  return false;
}

Assistant:

bool _multiply_source_and_add_to_column(const typename Column::Field_element& val,
                                        const Entry_range& source,
                                        Column& targetColumn)
{
  if (val == 0u) {
    return false;
  }

  return _generic_add_to_column(
      source,
      targetColumn,
      []([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&](typename Entry_range::const_iterator& itSource, const typename Column::Column_support::iterator& itTarget) {
        typename Column::Entry* entry =
            targetColumn._insert_entry(itSource->get_element(), itSource->get_row_index(), itTarget);
        targetColumn.operators_->multiply_inplace(entry->get_element(), val);
        if constexpr (Column::Master::Option_list::has_row_access) targetColumn.update_entry(*entry);
      },
      [&](typename Column::Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        targetColumn.operators_->multiply_and_add_inplace_back(itSource->get_element(), val, targetElement);
      },
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      []([[maybe_unused]] typename Column::Column_support::iterator& itTarget) {});
}